

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Saig_BmcDeriveFailed(Saig_Bmc_t *p,int iTargetFail)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = p->iOutputLast;
  p->iOutputFail = iVar1;
  iVar2 = p->iFrameLast;
  p->iFrameFail = iVar2;
  iVar3 = p->vTargets->nSize;
  if (iTargetFail < iVar3) {
    do {
      if (iVar1 == 0) {
        iVar1 = p->pAig->nTruePos;
        iVar2 = iVar2 + -1;
        p->iFrameFail = iVar2;
      }
      iVar1 = iVar1 + -1;
      iVar3 = iVar3 + -1;
    } while (iTargetFail < iVar3);
    p->iOutputFail = iVar1;
  }
  return;
}

Assistant:

void Saig_BmcDeriveFailed( Saig_Bmc_t * p, int iTargetFail )
{
    int k;
    p->iOutputFail = p->iOutputLast;
    p->iFrameFail  = p->iFrameLast;
    for ( k = Vec_PtrSize(p->vTargets); k > iTargetFail; k-- )
    {
        if ( p->iOutputFail == 0 )
        {
            p->iOutputFail = Saig_ManPoNum(p->pAig);
            p->iFrameFail--;
        }
        p->iOutputFail--;
    }
}